

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

void SZIP_global_init(void)

{
  if (SZIP_global_init::generatedTable == 0) {
    SZIP_global_init::generatedTable = 1;
    CrcGenerateTable();
  }
  return;
}

Assistant:

void SZIP_global_init(void)
{
    /* this just needs to calculate some things, so it only ever
       has to run once, even after a deinit. */
    static int generatedTable = 0;
    if (!generatedTable)
    {
        generatedTable = 1;
        CrcGenerateTable();
    } /* if */
}